

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

bool __thiscall miniros::names::Path::startsWith(Path *this,Path *other)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  Path *this_00;
  Path *pPVar5;
  Path *in_RSI;
  Path *in_RDI;
  string_view sVar6;
  int i;
  Path *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  char *pcVar7;
  int local_1c;
  bool local_1;
  
  bVar1 = isAbsolute(in_RDI);
  uVar2 = (uint)bVar1;
  bVar1 = isAbsolute(in_RSI);
  if (uVar2 == bVar1) {
    sVar3 = size(in_stack_ffffffffffffffa0);
    sVar4 = size(in_stack_ffffffffffffffa0);
    if (sVar4 < sVar3) {
      local_1 = false;
    }
    else {
      local_1c = 0;
      while( true ) {
        this_00 = (Path *)(long)local_1c;
        pPVar5 = (Path *)size(this_00);
        if (pPVar5 <= this_00) break;
        sVar6 = view(in_RDI,(int)(sVar3 >> 0x20));
        pcVar7 = (char *)sVar6._M_len;
        sVar6 = view(in_RDI,(int)(sVar3 >> 0x20));
        __x._M_str = pcVar7;
        __x._M_len = (size_t)sVar6._M_str;
        __y._M_len._4_4_ = uVar2;
        __y._M_len._0_4_ = in_stack_ffffffffffffffb8;
        __y._M_str = (char *)sVar6._M_len;
        bVar1 = std::operator!=(__x,__y);
        if (bVar1) {
          return false;
        }
        local_1c = local_1c + 1;
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Path::startsWith(const Path& other) const
{
  if (isAbsolute() != other.isAbsolute())
    return false;
  if (other.size() > size())
    return false;
  for (int i = 0; i < other.size(); i++) {
    if (view(i) != other.view(i))
      return false;
  }
  return true;
}